

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjunctiveMonotone.c
# Opt level: O1

void appendVecToMasterVecInt(Vec_Ptr_t *masterVec,Vec_Ptr_t *candVec)

{
  uint uVar1;
  void *pvVar2;
  int *piVar3;
  void *__dest;
  void **ppvVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  
  if (masterVec == (Vec_Ptr_t *)0x0) {
    __assert_fail("masterVec != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/disjunctiveMonotone.c"
                  ,0x23c,"void appendVecToMasterVecInt(Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  if (candVec == (Vec_Ptr_t *)0x0) {
    __assert_fail("candVec != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/disjunctiveMonotone.c"
                  ,0x23d,"void appendVecToMasterVecInt(Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  if (0 < candVec->nSize) {
    lVar7 = 0;
    do {
      pvVar2 = candVec->pArray[lVar7];
      piVar3 = (int *)malloc(0x10);
      iVar5 = *(int *)((long)pvVar2 + 4);
      lVar6 = (long)iVar5;
      piVar3[1] = iVar5;
      *piVar3 = iVar5;
      if (lVar6 == 0) {
        __dest = (void *)0x0;
      }
      else {
        __dest = malloc(lVar6 * 4);
      }
      *(void **)(piVar3 + 2) = __dest;
      memcpy(__dest,*(void **)((long)pvVar2 + 8),lVar6 << 2);
      uVar1 = masterVec->nCap;
      if (masterVec->nSize == uVar1) {
        if ((int)uVar1 < 0x10) {
          if (masterVec->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(masterVec->pArray,0x80);
          }
          masterVec->pArray = ppvVar4;
          iVar5 = 0x10;
        }
        else {
          iVar5 = uVar1 * 2;
          if (iVar5 <= (int)uVar1) goto LAB_005b0ea8;
          if (masterVec->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar4 = (void **)realloc(masterVec->pArray,(ulong)uVar1 << 4);
          }
          masterVec->pArray = ppvVar4;
        }
        masterVec->nCap = iVar5;
      }
LAB_005b0ea8:
      iVar5 = masterVec->nSize;
      masterVec->nSize = iVar5 + 1;
      masterVec->pArray[iVar5] = piVar3;
      lVar7 = lVar7 + 1;
    } while (lVar7 < candVec->nSize);
  }
  return;
}

Assistant:

void appendVecToMasterVecInt(Vec_Ptr_t *masterVec, Vec_Ptr_t *candVec )
{
	int i;
	Vec_Int_t *vCand;
	Vec_Int_t *vNewIntVec;

	assert(masterVec != NULL);
	assert(candVec != NULL);
	Vec_PtrForEachEntry( Vec_Int_t *, candVec, vCand, i )
	{
		vNewIntVec = Vec_IntDup(vCand);	
		Vec_PtrPush(masterVec, vNewIntVec);
	}
}